

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O2

void __thiscall Game::printGameLost(Game *this)

{
  int *piVar1;
  int *n;
  int *piVar2;
  
  std::operator<<((ostream *)&std::cout,"You lost. The number was: ");
  piVar1 = (this->referenceNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar2 = (this->referenceNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    std::ostream::operator<<((ostream *)&std::cout,*piVar2);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  return;
}

Assistant:

void Game::printGameLost()
{
	std::cout << "You lost. The number was: ";
	for (auto&& n : referenceNumbers)
		std::cout << n;
	std::cout << '\n';
}